

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  ushort *puVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  bVar3 = (k->res).ulog2;
  iVar9 = 2 << (bVar3 & 0x1f);
  lVar7 = (long)iVar9 * (long)k->vw;
  if ((int)lVar7 != 0) {
    puVar6 = (ushort *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 4);
    puVar1 = puVar6 + lVar7;
    pfVar8 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar11 = *pfVar5;
      fVar10 = *(float *)(PtexHalf::h2fTable + (ulong)*puVar6 * 4) * fVar11;
      fVar11 = *(float *)(PtexHalf::h2fTable + (ulong)puVar6[1] * 4) * fVar11;
      if (iVar4 != 1) {
        lVar7 = 0;
        do {
          fVar2 = *(float *)((long)pfVar5 + lVar7 + 4);
          fVar10 = fVar10 + fVar2 * *(float *)(PtexHalf::h2fTable +
                                              (ulong)*(ushort *)((long)puVar6 + lVar7 + 4) * 4);
          fVar11 = fVar11 + fVar2 * *(float *)(PtexHalf::h2fTable +
                                              (ulong)*(ushort *)((long)puVar6 + lVar7 + 6) * 4);
          lVar7 = lVar7 + 4;
        } while ((long)(iVar4 * 2) * 2 + -4 != lVar7);
        puVar6 = (ushort *)((long)puVar6 + lVar7);
      }
      fVar2 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar11 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar10 + (float)*(undefined8 *)result);
      puVar6 = puVar6 + (long)(iVar9 + iVar4 * -2) + 2;
    } while (puVar6 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }